

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne_twister.hpp
# Opt level: O0

void __thiscall
boost::random::
mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
::normalize_state(mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
                  *this)

{
  uint uVar1;
  size_t j;
  uint y0;
  uint lower_mask;
  uint upper_mask;
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  *this_local;
  
  uVar1 = this->x[0x18c] ^ this->x[0x26f];
  if ((uVar1 & 0x80000000) == 0) {
    y0 = uVar1 << 1;
  }
  else {
    y0 = (uVar1 ^ 0x9908b0df) << 1 | 1;
  }
  this->x[0] = this->x[0] & 0x80000000 | y0 & 0x7fffffff;
  j = 0;
  while( true ) {
    if (0x26f < j) {
      this->x[0] = 0x80000000;
      return;
    }
    if (this->x[j] != 0) break;
    j = j + 1;
  }
  return;
}

Assistant:

void normalize_state()
    {
        const UIntType upper_mask = (~static_cast<UIntType>(0)) << r;
        const UIntType lower_mask = ~upper_mask;
        UIntType y0 = x[m-1] ^ x[n-1];
        if(y0 & (static_cast<UIntType>(1) << (w-1))) {
            y0 = ((y0 ^ a) << 1) | 1;
        } else {
            y0 = y0 << 1;
        }
        x[0] = (x[0] & upper_mask) | (y0 & lower_mask);

        // fix up the state if it's all zeroes.
        for(std::size_t j = 0; j < n; ++j) {
            if(x[j] != 0) return;
        }
        x[0] = static_cast<UIntType>(1) << (w-1);
    }